

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall tournser::print_summary(tournser *this)

{
  ofstream *poVar1;
  ostream *poVar2;
  index_t i;
  long lVar3;
  vector<float,_std::allocator<float>_> inf_pairs;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  if (this->python == false) {
    num_infinite_pairs((vector<float,_std::allocator<float>_> *)&local_48,this);
    poVar1 = &this->outfile;
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    poVar2 = std::operator<<((ostream *)poVar1,"# Betti Numbers:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar3 = 0; lVar3 <= this->dim_max; lVar3 = lVar3 + 1) {
      poVar2 = std::operator<<((ostream *)poVar1,"#        dim H_");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," = ");
      std::ostream::operator<<(poVar2,local_48._M_impl.super__Vector_impl_data._M_start[lVar3]);
      if ((this->skipped_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar3] != 0) {
        poVar2 = std::operator<<((ostream *)poVar1," : (");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2," entries skipped)");
      }
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    poVar2 = std::operator<<((ostream *)poVar1,"# Cell Counts:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar3 = 0; lVar3 <= this->dim_max; lVar3 = lVar3 + 1) {
      poVar2 = std::operator<<((ostream *)poVar1,"#        dim C_");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," = ");
      delta_complex_t::number_of_cells(this->complex,lVar3);
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::ostream::flush();
    std::ofstream::close();
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void print_summary(){
		if(!python){
			std::vector<value_t> inf_pairs = num_infinite_pairs();
			outfile << std::endl;
			outfile << "# Betti Numbers:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim H_" << i << " = " << inf_pairs[i];
				if( skipped_entries[i] > 0){
					outfile << " : (" << skipped_entries[i] << " entries skipped)";
				}
				outfile << std::endl;
			}
			outfile << std::endl;
			outfile << "# Cell Counts:" << std::endl;
			for(index_t i = 0; i <= dim_max; i++){
				outfile << "#        dim C_" << i << " = " << complex->number_of_cells(i) << std::endl;
			}
			outfile.flush();
			outfile.close();
		}
	}